

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignerInfo.c
# Opt level: O2

_Bool COSE_Signer_SetKey(HCOSE_SIGNER h,cn_cbor *pKey,cose_errback *perr)

{
  _Bool _Var1;
  
  _Var1 = IsValidSignerHandle(h);
  if (_Var1) {
    if (pKey != (cn_cbor *)0x0) {
      *(cn_cbor **)(h + 0x58) = pKey;
      return true;
    }
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return false;
}

Assistant:

bool COSE_Signer_SetKey(HCOSE_SIGNER h, const cn_cbor * pKey, cose_errback * perr)
{
	COSE_SignerInfo * p;
	bool fRet = false;

	CHECK_CONDITION(IsValidSignerHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pKey != NULL, COSE_ERR_INVALID_PARAMETER);

	p = (COSE_SignerInfo *)h;
	p->m_pkey = pKey;

	fRet = true;
errorReturn:
	return fRet;
}